

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

shared_ptr<mocker::ir::Addr> __thiscall
mocker::ir::Builder::translateNewArray
          (Builder *this,shared_ptr<mocker::ast::Type> *rawCurType,
          queue<std::shared_ptr<mocker::ir::Addr>,_std::deque<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
          *sizeProvided)

{
  string *psVar1;
  BuilderContext *pBVar2;
  bool bVar3;
  FunctionModule *this_00;
  element_type *peVar4;
  reference pvVar5;
  queue<std::shared_ptr<mocker::ir::Addr>,_std::deque<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
  *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::ir::Addr> sVar6;
  bool local_46b;
  shared_ptr<mocker::ir::IRInst> local_3e8;
  shared_ptr<mocker::ir::Addr> local_3d8;
  OpType local_3c8;
  allocator<char> local_3c1;
  string local_3c0 [32];
  undefined1 local_3a0 [8];
  shared_ptr<mocker::ir::Reg> nextElementPtr;
  undefined1 local_380 [8];
  shared_ptr<mocker::ir::Addr> elementInstPtr;
  OpType local_368;
  allocator<char> local_361;
  string local_360 [32];
  undefined1 local_340 [8];
  shared_ptr<mocker::ir::Reg> cmpRes;
  string local_328 [32];
  undefined1 local_308 [8];
  shared_ptr<mocker::ir::Reg> curElementPtr;
  shared_ptr<mocker::ir::IRInst> local_2f0;
  undefined1 local_2e0 [8];
  shared_ptr<mocker::ir::Jump> jump2condition;
  undefined1 local_2c8 [8];
  shared_ptr<mocker::ir::Label> successorLabel;
  iterator local_2b0;
  BBLIter successorBB;
  undefined1 local_2a0 [8];
  shared_ptr<mocker::ir::Label> bodyLabel;
  iterator local_288;
  BBLIter bodyFirstBB;
  undefined1 local_278 [8];
  shared_ptr<mocker::ir::Label> conditionLabel;
  iterator local_260;
  BBLIter conditionFirstBB;
  BBLIter originBB;
  string local_248 [32];
  undefined1 local_228 [8];
  shared_ptr<mocker::ir::Reg> contentEndPtr;
  shared_ptr<mocker::ir::IRInst> local_208;
  BBLIter local_1f8;
  allocator<char> local_1e9;
  string local_1e8 [32];
  undefined1 local_1c8 [8];
  shared_ptr<mocker::ir::Reg> curElementPtrPtr;
  undefined1 local_1b0 [8];
  shared_ptr<void_*> defer;
  shared_ptr<mocker::ir::Addr> local_188;
  OpType local_178;
  allocator<char> local_171;
  string local_170 [32];
  undefined1 local_150 [8];
  shared_ptr<mocker::ir::Reg> arrayInstPtr;
  string local_138 [32];
  undefined1 local_118 [8];
  shared_ptr<mocker::ir::Reg> memPtr;
  OpType local_f4;
  shared_ptr<mocker::ir::Addr> local_f0;
  OpType local_e0;
  allocator<char> local_d9;
  string local_d8 [32];
  undefined1 local_b8 [8];
  shared_ptr<mocker::ir::Reg> contentLen;
  string local_a0 [32];
  undefined1 local_80 [8];
  shared_ptr<mocker::ir::Reg> memLen;
  undefined1 local_60 [8];
  value_type size;
  shared_ptr<mocker::ast::Type> elementType;
  shared_ptr<mocker::ast::ArrayType> curType;
  FunctionModule *func;
  queue<std::shared_ptr<mocker::ir::Addr>,_std::deque<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
  *sizeProvided_local;
  shared_ptr<mocker::ast::Type> *rawCurType_local;
  Builder *this_local;
  
  this_00 = BuilderContext::getCurFunc
                      ((BuilderContext *)
                       (rawCurType->
                       super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi);
  std::dynamic_pointer_cast<mocker::ast::ArrayType,mocker::ast::Type>
            ((shared_ptr<mocker::ast::Type> *)
             &elementType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  bVar3 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)
                     &elementType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  if (bVar3) {
    peVar4 = std::
             __shared_ptr_access<mocker::ast::ArrayType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mocker::ast::ArrayType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&elementType.
                            super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
    std::shared_ptr<mocker::ast::Type>::shared_ptr
              ((shared_ptr<mocker::ast::Type> *)
               &size.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &peVar4->baseType);
    pvVar5 = std::
             queue<std::shared_ptr<mocker::ir::Addr>,_std::deque<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
             ::front(in_RCX);
    std::shared_ptr<mocker::ir::Addr>::shared_ptr((shared_ptr<mocker::ir::Addr> *)local_60,pvVar5);
    std::
    queue<std::shared_ptr<mocker::ir::Addr>,_std::deque<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
    ::pop(in_RCX);
    psVar1 = (string *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_a0,"memLen",
               (allocator<char> *)
               ((long)&contentLen.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    BuilderContext::makeTempLocalReg((BuilderContext *)local_80,psVar1);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&contentLen.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    BuilderContext::emplaceInst<mocker::ir::AttachedComment,char_const(&)[28]>
              ((BuilderContext *)
               (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi,(char (*) [28])"Calculate the memory needed");
    psVar1 = (string *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_d8,"contentLen",&local_d9);
    BuilderContext::makeTempLocalReg((BuilderContext *)local_b8,psVar1);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator(&local_d9);
    pBVar2 = (BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    local_e0 = Mul;
    makeILit((Builder *)&local_f0,(Integer)rawCurType);
    BuilderContext::
    emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Addr>&>
              (pBVar2,(shared_ptr<mocker::ir::Reg> *)local_b8,&local_e0,&local_f0,
               (shared_ptr<mocker::ir::Addr> *)local_60);
    std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_f0);
    pBVar2 = (BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    local_f4 = Add;
    makeILit((Builder *)
             &memPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Integer)rawCurType);
    BuilderContext::
    emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>>
              (pBVar2,(shared_ptr<mocker::ir::Reg> *)local_80,&local_f4,
               (shared_ptr<mocker::ir::Reg> *)local_b8,
               (shared_ptr<mocker::ir::Addr> *)
               &memPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<mocker::ir::Addr>::~shared_ptr
              ((shared_ptr<mocker::ir::Addr> *)
               &memPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    psVar1 = (string *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_138,"memPtr",
               (allocator<char> *)
               ((long)&arrayInstPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    BuilderContext::makeTempLocalReg((BuilderContext *)local_118,psVar1);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&arrayInstPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    BuilderContext::
    emplaceInst<mocker::ir::Malloc,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
              ((BuilderContext *)
               (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_118,
               (shared_ptr<mocker::ir::Reg> *)local_80);
    psVar1 = (string *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_170,"arrayInstPtr",&local_171);
    BuilderContext::makeTempLocalReg((BuilderContext *)local_150,psVar1);
    std::__cxx11::string::~string(local_170);
    std::allocator<char>::~allocator(&local_171);
    pBVar2 = (BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    local_178 = Add;
    makeILit((Builder *)&local_188,(Integer)rawCurType);
    BuilderContext::
    emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>>
              (pBVar2,(shared_ptr<mocker::ir::Reg> *)local_150,&local_178,
               (shared_ptr<mocker::ir::Reg> *)local_118,&local_188);
    std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_188);
    BuilderContext::
    emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>&>
              ((BuilderContext *)
               (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_118,
               (shared_ptr<mocker::ir::Addr> *)local_60);
    bVar3 = isIntTy((Builder *)rawCurType,
                    (shared_ptr<mocker::ast::Type> *)
                    &size.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
    if ((bVar3) ||
       (bVar3 = isBoolTy((Builder *)rawCurType,
                         (shared_ptr<mocker::ast::Type> *)
                         &size.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount), bVar3)) {
      std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                ((shared_ptr<mocker::ir::Addr> *)this,(shared_ptr<mocker::ir::Reg> *)local_150);
    }
    else {
      std::dynamic_pointer_cast<mocker::ast::ArrayType,mocker::ast::Type>
                ((shared_ptr<mocker::ast::Type> *)
                 &defer.super___shared_ptr<void_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      bVar3 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         &defer.super___shared_ptr<void_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      local_46b = false;
      if (bVar3) {
        local_46b = std::
                    queue<std::shared_ptr<mocker::ir::Addr>,_std::deque<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
                    ::empty(in_RCX);
      }
      std::shared_ptr<mocker::ast::ArrayType>::~shared_ptr
                ((shared_ptr<mocker::ast::ArrayType> *)
                 &defer.super___shared_ptr<void_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (local_46b == false) {
        BuilderContext::emplaceInst<mocker::ir::Comment,char_const(&)[26]>
                  ((BuilderContext *)
                   (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi,(char (*) [26])"init the content of array");
        curElementPtrPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)rawCurType;
        std::shared_ptr<void*>::
        shared_ptr<mocker::ir::Builder::translateNewArray(std::shared_ptr<mocker::ast::Type>const&,std::queue<std::shared_ptr<mocker::ir::Addr>,std::deque<std::shared_ptr<mocker::ir::Addr>,std::allocator<std::shared_ptr<mocker::ir::Addr>>>>&)const::__0>
                  ((shared_ptr<void*> *)local_1b0,(nullptr_t)0x0,
                   (anon_class_8_1_8991fb9c_for__M_tp)rawCurType);
        psVar1 = (string *)
                 (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_1e8,"curElementPtrPtr",&local_1e9);
        BuilderContext::makeTempLocalReg((BuilderContext *)local_1c8,psVar1);
        std::__cxx11::string::~string(local_1e8);
        std::allocator<char>::~allocator(&local_1e9);
        pBVar2 = (BuilderContext *)
                 (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        local_1f8 = FunctionModule::getFirstBB(this_00);
        std::make_shared<mocker::ir::Alloca,std::shared_ptr<mocker::ir::Reg>&>
                  ((shared_ptr<mocker::ir::Reg> *)
                   &contentEndPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Alloca,void>
                  (&local_208,
                   (shared_ptr<mocker::ir::Alloca> *)
                   &contentEndPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        BuilderContext::appendInstFront(pBVar2,local_1f8,&local_208);
        std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_208);
        std::shared_ptr<mocker::ir::Alloca>::~shared_ptr
                  ((shared_ptr<mocker::ir::Alloca> *)
                   &contentEndPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        BuilderContext::
        emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
                  ((BuilderContext *)
                   (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_1c8,
                   (shared_ptr<mocker::ir::Reg> *)local_150);
        psVar1 = (string *)
                 (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_248,"contentEndPtr",(allocator<char> *)((long)&originBB._M_node + 7));
        BuilderContext::makeTempLocalReg((BuilderContext *)local_228,psVar1);
        std::__cxx11::string::~string(local_248);
        std::allocator<char>::~allocator((allocator<char> *)((long)&originBB._M_node + 7));
        originBB._M_node._0_4_ = 5;
        BuilderContext::
        emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
                  ((BuilderContext *)
                   (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_228,(OpType *)&originBB,
                   (shared_ptr<mocker::ir::Reg> *)local_150,(shared_ptr<mocker::ir::Reg> *)local_b8)
        ;
        conditionLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 BuilderContext::getCurBasicBlock
                           ((BuilderContext *)
                            (rawCurType->
                            super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                            _M_refcount._M_pi);
        conditionFirstBB._M_node =
             (_List_node_base *)
             conditionLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        local_260._M_node =
             (_List_node_base *)
             FunctionModule::insertBBAfter
                       (this_00,(BBLIter)conditionLabel.
                                         super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi);
        std::_List_const_iterator<mocker::ir::BasicBlock>::_List_const_iterator
                  ((_List_const_iterator<mocker::ir::BasicBlock> *)&bodyFirstBB,&local_260);
        getBBLabel((Builder *)local_278,(const_iterator)rawCurType);
        bodyLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._M_node;
        local_288._M_node =
             (_List_node_base *)FunctionModule::insertBBAfter(this_00,local_260._M_node);
        std::_List_const_iterator<mocker::ir::BasicBlock>::_List_const_iterator
                  ((_List_const_iterator<mocker::ir::BasicBlock> *)&successorBB,&local_288);
        getBBLabel((Builder *)local_2a0,(const_iterator)rawCurType);
        successorLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._M_node;
        local_2b0._M_node =
             (_List_node_base *)FunctionModule::insertBBAfter(this_00,local_288._M_node);
        std::_List_const_iterator<mocker::ir::BasicBlock>::_List_const_iterator
                  ((_List_const_iterator<mocker::ir::BasicBlock> *)
                   &jump2condition.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,&local_2b0);
        getBBLabel((Builder *)local_2c8,(const_iterator)rawCurType);
        std::make_shared<mocker::ir::Jump,std::shared_ptr<mocker::ir::Label>&>
                  ((shared_ptr<mocker::ir::Label> *)local_2e0);
        pBVar2 = (BuilderContext *)
                 (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Jump,void>
                  (&local_2f0,(shared_ptr<mocker::ir::Jump> *)local_2e0);
        BuilderContext::appendInst(pBVar2,&local_2f0);
        std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_2f0);
        curElementPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._M_node;
        BuilderContext::setCurBasicBlock
                  ((BuilderContext *)
                   (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi,(BBLIter)local_260._M_node);
        psVar1 = (string *)
                 (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_328,"curElementPtr",
                   (allocator<char> *)
                   ((long)&cmpRes.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        BuilderContext::makeTempLocalReg((BuilderContext *)local_308,psVar1);
        std::__cxx11::string::~string(local_328);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&cmpRes.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        BuilderContext::
        emplaceInst<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
                  ((BuilderContext *)
                   (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_308,
                   (shared_ptr<mocker::ir::Reg> *)local_1c8);
        psVar1 = (string *)
                 (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_360,"cmpRes",&local_361);
        BuilderContext::makeTempLocalReg((BuilderContext *)local_340,psVar1);
        std::__cxx11::string::~string(local_360);
        std::allocator<char>::~allocator(&local_361);
        local_368 = Ne;
        BuilderContext::
        emplaceInst<mocker::ir::RelationInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::RelationInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
                  ((BuilderContext *)
                   (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_340,&local_368,
                   (shared_ptr<mocker::ir::Reg> *)local_308,(shared_ptr<mocker::ir::Reg> *)local_228
                  );
        BuilderContext::
        emplaceInst<mocker::ir::Branch,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Label>&,std::shared_ptr<mocker::ir::Label>&>
                  ((BuilderContext *)
                   (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_340,
                   (shared_ptr<mocker::ir::Label> *)local_2a0,
                   (shared_ptr<mocker::ir::Label> *)local_2c8);
        elementInstPtr.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._M_node;
        BuilderContext::setCurBasicBlock
                  ((BuilderContext *)
                   (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi,(BBLIter)local_288._M_node);
        std::dynamic_pointer_cast<mocker::ast::ArrayType,mocker::ast::Type>
                  ((shared_ptr<mocker::ast::Type> *)
                   &nextElementPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        bVar3 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)
                           &nextElementPtr.
                            super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        if (bVar3) {
          translateNewArray((Builder *)local_380,rawCurType,
                            (queue<std::shared_ptr<mocker::ir::Addr>,_std::deque<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
                             *)&size.
                                super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
        }
        else {
          makeNewNonarray((Builder *)local_380,rawCurType);
        }
        std::shared_ptr<mocker::ast::ArrayType>::~shared_ptr
                  ((shared_ptr<mocker::ast::ArrayType> *)
                   &nextElementPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        BuilderContext::
        emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>&>
                  ((BuilderContext *)
                   (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_308,
                   (shared_ptr<mocker::ir::Addr> *)local_380);
        psVar1 = (string *)
                 (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_3c0,"nextElementPtr",&local_3c1);
        BuilderContext::makeTempLocalReg((BuilderContext *)local_3a0,psVar1);
        std::__cxx11::string::~string(local_3c0);
        std::allocator<char>::~allocator(&local_3c1);
        pBVar2 = (BuilderContext *)
                 (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        local_3c8 = Add;
        makeILit((Builder *)&local_3d8,(Integer)rawCurType);
        BuilderContext::
        emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>>
                  (pBVar2,(shared_ptr<mocker::ir::Reg> *)local_3a0,&local_3c8,
                   (shared_ptr<mocker::ir::Reg> *)local_308,&local_3d8);
        std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_3d8);
        BuilderContext::
        emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
                  ((BuilderContext *)
                   (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_1c8,
                   (shared_ptr<mocker::ir::Reg> *)local_3a0);
        pBVar2 = (BuilderContext *)
                 (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Jump,void>
                  (&local_3e8,(shared_ptr<mocker::ir::Jump> *)local_2e0);
        BuilderContext::appendInst(pBVar2,&local_3e8);
        std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_3e8);
        BuilderContext::setCurBasicBlock
                  ((BuilderContext *)
                   (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi,(BBLIter)local_2b0._M_node);
        std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                  ((shared_ptr<mocker::ir::Addr> *)this,(shared_ptr<mocker::ir::Reg> *)local_150);
        std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_3a0);
        std::shared_ptr<mocker::ir::Addr>::~shared_ptr((shared_ptr<mocker::ir::Addr> *)local_380);
        std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_340);
        std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_308);
        std::shared_ptr<mocker::ir::Jump>::~shared_ptr((shared_ptr<mocker::ir::Jump> *)local_2e0);
        std::shared_ptr<mocker::ir::Label>::~shared_ptr((shared_ptr<mocker::ir::Label> *)local_2c8);
        std::shared_ptr<mocker::ir::Label>::~shared_ptr((shared_ptr<mocker::ir::Label> *)local_2a0);
        std::shared_ptr<mocker::ir::Label>::~shared_ptr((shared_ptr<mocker::ir::Label> *)local_278);
        std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_228);
        std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_1c8);
        std::shared_ptr<void_*>::~shared_ptr((shared_ptr<void_*> *)local_1b0);
      }
      else {
        std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                  ((shared_ptr<mocker::ir::Addr> *)this,(shared_ptr<mocker::ir::Reg> *)local_150);
      }
    }
    std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_150);
    std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_118);
    std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_b8);
    std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_80);
    std::shared_ptr<mocker::ir::Addr>::~shared_ptr((shared_ptr<mocker::ir::Addr> *)local_60);
    std::shared_ptr<mocker::ast::Type>::~shared_ptr
              ((shared_ptr<mocker::ast::Type> *)
               &size.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<mocker::ast::ArrayType>::~shared_ptr
              ((shared_ptr<mocker::ast::ArrayType> *)
               &elementType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    sVar6.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar6.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<mocker::ir::Addr>)
           sVar6.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>;
  }
  __assert_fail("curType",
                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp"
                ,0x2d1,
                "std::shared_ptr<Addr> mocker::ir::Builder::translateNewArray(const std::shared_ptr<ast::Type> &, std::queue<std::shared_ptr<Addr>> &) const"
               );
}

Assistant:

std::shared_ptr<Addr> Builder::translateNewArray(
    const std::shared_ptr<ast::Type> &rawCurType,
    std::queue<std::shared_ptr<Addr>> &sizeProvided) const {
  // We describe the translation of statements "new T[N]" here. First, note that
  // the result is a pointer arrayInstPtr, which points to the address of the
  // first element of the array. (The length of the array is store in front of
  // the array elements.) It is the return value of this function. Hence, the
  // first step is
  //   1. to malloc a piece of memory of length 8 + 8 * N and store the address
  //      + 8 into arrayInstPtr;
  //   2. and store N into the first 8 bytes.
  // Then, we shall construct the array. If T is int or bool, then there is
  // nothing to do. Otherwise, we shall construct each element via a loop. To
  // implement the loop, we first need aa temporary variable to store the
  // address of the current element since our registers are of SSA form, that
  // is, they can not be assigned more than once. Namely, we shall
  //   3. alloca a piece of memory for the temporary varaible and store the
  //      address into the register curElementPtrPtr. And store the address of
  //      the head, namely, the contentPtr, into the address stored in
  //      curElementPtrPtr. (Meanwhile, we shall compute the address of the
  //      end of the array for later use.)
  // After finishing the routine of creating basic blocks and labels, we
  // construct the condition for the loop to end.
  //   4. Load curElementPtr from the address stored in curElementPtrPtr.
  //   5. Compare it with the end pointer and jump according to the result.
  // Now we implement the body of the loop. In fact, what we need to do is just
  // initializing the current element.
  //   6. New an element. (See next section for details.)
  //   7. Store the address into the current element.
  //   8. Update the loop variable and jump back to the condition basic block.
  //
  // In this passage, we handle some details. First, we need to support newing
  // a jagged array. To achieve this, we let this function to be recursive, that
  // is, in step 6., if the type of the element is still array, then, instead of
  // newing an element, we call this function recursively and pass down the
  // remaining provided sizes.
  // Note that the number of sizes provided may be less than the dimension of
  // the array. This case is similar to the int/bool case. We just return after
  // step 2., leaving the elements uninitialized.

  auto &func = ctx.getCurFunc();
  auto curType = std::dynamic_pointer_cast<ast::ArrayType>(rawCurType);
  assert(curType);
  auto elementType = curType->baseType;

  // 1.
  auto size = sizeProvided.front();
  sizeProvided.pop();
  auto memLen = ctx.makeTempLocalReg("memLen");
  ctx.emplaceInst<AttachedComment>("Calculate the memory needed");
  auto contentLen = ctx.makeTempLocalReg("contentLen");
  ctx.emplaceInst<ArithBinaryInst>(contentLen, ArithBinaryInst::Mul,
                                   makeILit(8),
                                   size); // calcMemLen
  ctx.emplaceInst<ArithBinaryInst>(memLen, ArithBinaryInst::Add, contentLen,
                                   makeILit(8));
  auto memPtr = ctx.makeTempLocalReg("memPtr");
  ctx.emplaceInst<Malloc>(memPtr, memLen);

  auto arrayInstPtr = ctx.makeTempLocalReg("arrayInstPtr");
  ctx.emplaceInst<ArithBinaryInst>(arrayInstPtr, ArithBinaryInst::Add, memPtr,
                                   makeILit(8));

  // 2.
  ctx.emplaceInst<Store>(memPtr, size);

  // 3.
  if (isIntTy(elementType) || isBoolTy(elementType))
    return arrayInstPtr;
  if ((bool)std::dynamic_pointer_cast<ast::ArrayType>(elementType) &&
      sizeProvided.empty())
    return arrayInstPtr;

  ctx.emplaceInst<Comment>("init the content of array");
  auto defer = std::shared_ptr<void *>(
      nullptr, [this](void *) { ctx.emplaceInst<Comment>(""); });

  auto curElementPtrPtr = ctx.makeTempLocalReg("curElementPtrPtr");
  ctx.appendInstFront(func.getFirstBB(),
                      std::make_shared<Alloca>(curElementPtrPtr));
  ctx.emplaceInst<Store>(curElementPtrPtr, arrayInstPtr);
  auto contentEndPtr = ctx.makeTempLocalReg("contentEndPtr");
  // calcContentEndPtr
  ctx.emplaceInst<ArithBinaryInst>(contentEndPtr, ArithBinaryInst::Add,
                                   arrayInstPtr, contentLen);

  auto originBB = ctx.getCurBasicBlock();
  auto conditionFirstBB = func.insertBBAfter(originBB);
  auto conditionLabel = getBBLabel(conditionFirstBB);
  auto bodyFirstBB = func.insertBBAfter(conditionFirstBB);
  auto bodyLabel = getBBLabel(bodyFirstBB);
  auto successorBB = func.insertBBAfter(bodyFirstBB);
  auto successorLabel = getBBLabel(successorBB);

  auto jump2condition = std::make_shared<Jump>(conditionLabel);
  ctx.appendInst(jump2condition);

  // 4.
  ctx.setCurBasicBlock(conditionFirstBB);
  auto curElementPtr = ctx.makeTempLocalReg("curElementPtr");
  ctx.emplaceInst<Load>(curElementPtr, curElementPtrPtr);
  // 5.
  auto cmpRes = ctx.makeTempLocalReg("cmpRes");
  ctx.emplaceInst<RelationInst>(cmpRes, RelationInst::Ne, curElementPtr,
                                contentEndPtr);
  ctx.emplaceInst<Branch>(cmpRes, bodyLabel, successorLabel);

  // 6.
  ctx.setCurBasicBlock(bodyFirstBB);
  auto elementInstPtr =
      (bool)std::dynamic_pointer_cast<ast::ArrayType>(elementType)
          ? translateNewArray(elementType, sizeProvided)
          : makeNewNonarray(elementType);
  // 7.
  ctx.emplaceInst<Store>(curElementPtr, elementInstPtr);
  // 8.
  auto nextElementPtr = ctx.makeTempLocalReg("nextElementPtr");
  ctx.emplaceInst<ArithBinaryInst>(nextElementPtr, ArithBinaryInst::Add,
                                   curElementPtr,
                                   makeILit(8)); // calcNextElementPtr
  ctx.emplaceInst<Store>(curElementPtrPtr, nextElementPtr);
  ctx.appendInst(jump2condition);

  ctx.setCurBasicBlock(successorBB);
  return arrayInstPtr;
}